

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_stats.cpp
# Opt level: O2

string * __thiscall
duckdb::StructStats::ToString_abi_cxx11_
          (string *__return_storage_ptr__,StructStats *this,BaseStatistics *stats)

{
  child_list_t<LogicalType> *this_00;
  const_reference __lhs;
  long lVar1;
  ulong __n;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  this_00 = StructType::GetChildTypes_abi_cxx11_((LogicalType *)this);
  lVar1 = 0;
  for (__n = 0; __n < (ulong)(((long)(this_00->
                                     super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                     ).
                                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this_00->
                                    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                    ).
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x38);
      __n = __n + 1) {
    if (__n != 0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    __lhs = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
            ::get<true>(this_00,__n);
    ::std::operator+(&local_70,&__lhs->first,": ");
    BaseStatistics::ToString_abi_cxx11_
              (&local_90,(BaseStatistics *)(*(long *)(this + 0x50) + lVar1));
    ::std::operator+(&local_50,&local_70,&local_90);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_70);
    lVar1 = lVar1 + 0x58;
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string StructStats::ToString(const BaseStatistics &stats) {
	string result;
	result += " {";
	auto &child_types = StructType::GetChildTypes(stats.GetType());
	for (idx_t i = 0; i < child_types.size(); i++) {
		if (i > 0) {
			result += ", ";
		}
		result += child_types[i].first + ": " + stats.child_stats[i].ToString();
	}
	result += "}";
	return result;
}